

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

bool __thiscall presolve::HPresolve::isImpliedEquationAtUpper(HPresolve *this,HighsInt row)

{
  const_reference pvVar1;
  int in_ESI;
  long in_RDI;
  bool isUbndNegative;
  
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x238),(long)in_ESI);
  return *pvVar1 < -*(double *)(*(long *)(in_RDI + 8) + 0x120);
}

Assistant:

bool HPresolve::isImpliedEquationAtUpper(HighsInt row) const {
  // if the implied upper bound on a row dual is strictly negative then the row
  // is an implied equation (using its upper bound) due to complementary
  // slackness
  bool isUbndNegative =
      implRowDualUpper[row] < -options->dual_feasibility_tolerance;
  assert(!isUbndNegative || model->row_upper_[row] != kHighsInf);
  return isUbndNegative;
}